

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void gen_spr_970_pmu_user(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  _spr_register(env,0x309,"UPMC7",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_write_ureg,
                spr_read_ureg,spr_write_ureg,0);
  _spr_register(env,0x30a,"UPMC8",spr_read_ureg,spr_noaccess,spr_read_ureg,spr_write_ureg,
                spr_read_ureg,spr_write_ureg,0);
  return;
}

Assistant:

static void gen_spr_970_pmu_user(CPUPPCState *env)
{
    spr_register(env, SPR_970_UPMC7, "UPMC7",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, &spr_write_ureg,
                 0x00000000);
    spr_register(env, SPR_970_UPMC8, "UPMC8",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, &spr_write_ureg,
                 0x00000000);
}